

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O1

bool __thiscall QBmpHandler::canRead(QBmpHandler *this)

{
  bool bVar1;
  bool bVar2;
  QIODevice *device;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArray local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_format == BmpFormat && this->state == Ready) {
    device = QImageIOHandler::device(&this->super_QImageIOHandler);
    bVar1 = canRead(device);
    bVar2 = false;
    if ((!bVar1) || (bVar2 = false, this->state == Error)) goto LAB_0026ca46;
  }
  else if (this->state == Error) {
    bVar2 = false;
    goto LAB_0026ca46;
  }
  pcVar3 = "dib";
  if (this->m_format == BmpFormat) {
    pcVar3 = "bmp";
  }
  QByteArray::QByteArray(&local_30,pcVar3,-1);
  QImageIOHandler::setFormat(&this->super_QImageIOHandler,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,1,0x10);
    }
  }
  bVar2 = true;
LAB_0026ca46:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QBmpHandler::canRead() const
{
    if (m_format == BmpFormat && state == Ready && !canRead(device()))
        return false;

    if (state != Error) {
        setFormat(formatName());
        return true;
    }

    return false;
}